

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputClearUpdate(HelicsInput inp)

{
  InputObject *pIVar1;
  InputObject *inpObj;
  HelicsError *in_stack_ffffffffffffffe0;
  HelicsInput in_stack_ffffffffffffffe8;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pIVar1 != (InputObject *)0x0) {
    helics::Input::clearUpdate((Input *)0x1d1774);
  }
  return;
}

Assistant:

void helicsInputClearUpdate(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->clearUpdate();
    }
    // LCOV_EXCL_START
    catch (...) {
        ;
    }
    // LCOV_EXCL_STOP
}